

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Location loc_29;
  Location loc_30;
  Location loc_31;
  Location loc_32;
  Location loc_33;
  Location loc_34;
  Location loc_35;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  Token token_06;
  Token token_07;
  Token token_08;
  Token token_09;
  size_t sVar1;
  bool bVar2;
  TokenType TVar3;
  Opcode OVar4;
  Result RVar5;
  Enum EVar6;
  CallRefExpr *this_00;
  Expr *pEVar7;
  SelectExpr *this_01;
  TableCopyExpr *this_02;
  undefined **ppuVar8;
  long lVar9;
  int lane;
  int lane_00;
  Var *this_03;
  Token *pTVar10;
  Expr *pEVar11;
  Var *out_var;
  byte bVar12;
  Location loc;
  Token token;
  uint64_t lane_idx;
  Var table_index;
  Location local_2d0;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_2b0;
  Token local_298;
  Token local_258;
  Token local_218;
  Token local_1d8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  bVar12 = 0;
  GetLocation(&loc,this);
  TVar3 = Peek(this,0);
  switch(TVar3) {
  case AtomicFence:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    *(undefined8 *)&pEVar7->type_ = 5;
    ppuVar8 = &PTR__Expr_00192528;
    goto LAB_0013278b;
  case AtomicLoad:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_15.filename._M_str = loc.filename._M_str;
    loc_15.filename._M_len = loc.filename._M_len;
    loc_15.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_15.field_1._8_8_ = loc.field_1._8_8_;
    token_04.loc.filename._M_str = token.loc.filename._M_str;
    token_04.loc.filename._M_len = token.loc.filename._M_len;
    token_04.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_04.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_04.token_type_ = token.token_type_;
    token_04._36_4_ = token._36_4_;
    token_04.field_2.text_._M_len = token.field_2.text_._M_len;
    token_04.field_2.text_._M_str = token.field_2.text_._M_str;
    token_04.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_15,token_04,out_expr);
    break;
  case AtomicNotify:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_10.filename._M_str = loc.filename._M_str;
    loc_10.filename._M_len = loc.filename._M_len;
    loc_10.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_10.field_1._8_8_ = loc.field_1._8_8_;
    token_02.loc.filename._M_str = token.loc.filename._M_str;
    token_02.loc.filename._M_len = token.loc.filename._M_len;
    token_02.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_02.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_02.token_type_ = token.token_type_;
    token_02._36_4_ = token._36_4_;
    token_02.field_2.text_._M_len = token.field_2.text_._M_len;
    token_02.field_2.text_._M_str = token.field_2.text_._M_str;
    token_02.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_10,token_02,out_expr);
    break;
  case AtomicRmw:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_14.filename._M_str = loc.filename._M_str;
    loc_14.filename._M_len = loc.filename._M_len;
    loc_14.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_14.field_1._8_8_ = loc.field_1._8_8_;
    token_03.loc.filename._M_str = token.loc.filename._M_str;
    token_03.loc.filename._M_len = token.loc.filename._M_len;
    token_03.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_03.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_03.token_type_ = token.token_type_;
    token_03._36_4_ = token._36_4_;
    token_03.field_2.text_._M_len = token.field_2.text_._M_len;
    token_03.field_2.text_._M_str = token.field_2.text_._M_str;
    token_03.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_14,token_03,out_expr);
    break;
  case AtomicRmwCmpxchg:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_19.filename._M_str = loc.filename._M_str;
    loc_19.filename._M_len = loc.filename._M_len;
    loc_19.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_19.field_1._8_8_ = loc.field_1._8_8_;
    token_05.loc.filename._M_str = token.loc.filename._M_str;
    token_05.loc.filename._M_len = token.loc.filename._M_len;
    token_05.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_05.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_05.token_type_ = token.token_type_;
    token_05._36_4_ = token._36_4_;
    token_05.field_2.text_._M_len = token.field_2.text_._M_len;
    token_05.field_2.text_._M_str = token.field_2.text_._M_str;
    token_05.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_19,token_05,out_expr);
    break;
  case AtomicStore:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_20.filename._M_str = loc.filename._M_str;
    loc_20.filename._M_len = loc.filename._M_len;
    loc_20.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_20.field_1._8_8_ = loc.field_1._8_8_;
    token_06.loc.filename._M_str = token.loc.filename._M_str;
    token_06.loc.filename._M_len = token.loc.filename._M_len;
    token_06.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_06.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_06.token_type_ = token.token_type_;
    token_06._36_4_ = token._36_4_;
    token_06.field_2.text_._M_len = token.field_2.text_._M_len;
    token_06.field_2.text_._M_str = token.field_2.text_._M_str;
    token_06.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_20,token_06,out_expr);
    break;
  case AtomicWait:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_08.filename._M_str = loc.filename._M_str;
    loc_08.filename._M_len = loc.filename._M_len;
    loc_08.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_08.field_1._8_8_ = loc.field_1._8_8_;
    token_01.loc.filename._M_str = token.loc.filename._M_str;
    token_01.loc.filename._M_len = token.loc.filename._M_len;
    token_01.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_01.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_01.token_type_ = token.token_type_;
    token_01._36_4_ = token._36_4_;
    token_01.field_2.text_._M_len = token.field_2.text_._M_len;
    token_01.field_2.text_._M_str = token.field_2.text_._M_str;
    token_01.field_2.literal_.text._M_str = token.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)6>>
                      (this,loc_08,token_01,out_expr);
    break;
  case Binary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    this_00 = (CallRefExpr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = Binary;
    ppuVar8 = &PTR__Expr_00193358;
    goto LAB_0013259b;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0x9bb,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&token,this);
    loc_09.filename._M_str = loc.filename._M_str;
    loc_09.filename._M_len = loc.filename._M_len;
    loc_09.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_09.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_09,out_expr);
    break;
  case BrIf:
    Consume(&token,this);
    loc_06.filename._M_str = loc.filename._M_str;
    loc_06.filename._M_len = loc.filename._M_len;
    loc_06.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_06.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)10>>(this,loc_06,out_expr);
    break;
  case BrTable:
    Consume(&token,this);
    std::make_unique<wabt::BrTableExpr,wabt::Location&>(&token.loc);
    RVar5 = ParseVarList(this,(VarVector *)(token.loc.filename._M_len + 0x40));
    if (RVar5.enum_ != Error) {
      Var::operator=((Var *)(token.loc.filename._M_len + 0x58),
                     (Var *)(*(long *)(token.loc.filename._M_len + 0x48) + -0x48));
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back
                ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)(token.loc.filename._M_len + 0x40)
                );
      sVar1 = token.loc.filename._M_len;
      token.loc.filename._M_len = 0;
      pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)sVar1;
      if (pEVar7 == (Expr *)0x0) goto LAB_00132cab;
      (*pEVar7->_vptr_Expr[1])();
    }
    if (token.loc.filename._M_len != 0) {
      (**(code **)(*(long *)token.loc.filename._M_len + 8))();
    }
    break;
  case Call:
    Consume(&token,this);
    loc_03.filename._M_str = loc.filename._M_str;
    loc_03.filename._M_len = loc.filename._M_len;
    loc_03.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_03.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>(this,loc_03,out_expr);
    break;
  case CallIndirect:
    Consume(&token,this);
    std::make_unique<wabt::CallIndirectExpr,wabt::Location&>(&token.loc);
    this_03 = &local_78;
    goto LAB_00131dd7;
  case CallRef:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    this_00 = (CallRefExpr *)operator_new(0x88);
    CallRefExpr::CallRefExpr(this_00,&loc);
    goto LAB_001325a2;
  case Compare:
    pEVar7 = (Expr *)operator_new(0x40);
    Consume(&token,this);
    OVar4 = Token::opcode(&token);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = Compare;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_001933a8;
    *(Enum *)&pEVar7->field_0x3c = OVar4.enum_;
    pEVar11 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar7;
    goto LAB_00132794;
  case Const:
    Const::Const((Const *)&token);
    RVar5 = ParseConst(this,(Const *)&token,Normal);
    if (RVar5.enum_ != Error) {
      pEVar7 = (Expr *)operator_new(0x90);
      (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar7->loc).filename._M_len = loc.filename._M_len;
      (pEVar7->loc).filename._M_str = loc.filename._M_str;
      (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
      pEVar7->type_ = Const;
      pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_00192438;
      pTVar10 = &token;
      pEVar11 = pEVar7 + 1;
      for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
        pEVar11->_vptr_Expr = (_func_int **)(pTVar10->loc).filename._M_len;
        pTVar10 = (Token *)((long)pTVar10 + (ulong)bVar12 * -0x10 + 8);
        pEVar11 = (Expr *)((long)pEVar11 + ((ulong)bVar12 * -2 + 1) * 8);
      }
      goto LAB_0013278e;
    }
    goto LAB_00132b33;
  case Convert:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    this_00 = (CallRefExpr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = Convert;
    ppuVar8 = &PTR__Expr_001933f8;
    goto LAB_0013259b;
  case DataDrop:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_12.filename._M_str = loc.filename._M_str;
    loc_12.filename._M_len = loc.filename._M_len;
    loc_12.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_12.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)29>>(this,loc_12,out_expr);
    break;
  case Drop:
    Consume(&token,this);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = Drop;
    ppuVar8 = &PTR__Expr_00192dc8;
    goto LAB_0013278b;
  case ElemDrop:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_07.filename._M_str = loc.filename._M_str;
    loc_07.filename._M_len = loc.filename._M_len;
    loc_07.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_07.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>(this,loc_07,out_expr);
    break;
  case GlobalGet:
    Consume(&token,this);
    loc_04.filename._M_str = loc.filename._M_str;
    loc_04.filename._M_len = loc.filename._M_len;
    loc_04.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_04.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)20>>(this,loc_04,out_expr);
    break;
  case GlobalSet:
    Consume(&token,this);
    loc_13.filename._M_str = loc.filename._M_str;
    loc_13.filename._M_len = loc.filename._M_len;
    loc_13.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_13.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)21>>(this,loc_13,out_expr);
    break;
  case Load:
    Consume(&local_1d8,this);
    loc_27.filename._M_str = loc.filename._M_str;
    loc_27.filename._M_len = loc.filename._M_len;
    loc_27.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_27.field_1._8_8_ = loc.field_1._8_8_;
    token_07.loc.filename._M_str = local_1d8.loc.filename._M_str;
    token_07.loc.filename._M_len = local_1d8.loc.filename._M_len;
    token_07.loc.field_1.field_1.offset = local_1d8.loc.field_1.field_1.offset;
    token_07.loc.field_1._8_8_ = local_1d8.loc.field_1._8_8_;
    token_07.token_type_ = local_1d8.token_type_;
    token_07._36_4_ = local_1d8._36_4_;
    token_07.field_2.text_._M_len = local_1d8.field_2.text_._M_len;
    token_07.field_2.text_._M_str = local_1d8.field_2.text_._M_str;
    token_07.field_2.literal_.text._M_str = local_1d8.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)23>>
                      (this,loc_27,token_07,out_expr);
    break;
  case LocalGet:
    Consume(&token,this);
    loc_01.filename._M_str = loc.filename._M_str;
    loc_01.filename._M_len = loc.filename._M_len;
    loc_01.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_01.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_01,out_expr);
    break;
  case LocalSet:
    Consume(&token,this);
    loc_26.filename._M_str = loc.filename._M_str;
    loc_26.filename._M_len = loc.filename._M_len;
    loc_26.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_26.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)25>>(this,loc_26,out_expr);
    break;
  case LocalTee:
    Consume(&token,this);
    loc_30.filename._M_str = loc.filename._M_str;
    loc_30.filename._M_len = loc.filename._M_len;
    loc_30.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_30.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)26>>(this,loc_30,out_expr);
    break;
  case MemoryCopy:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_16.filename._M_str = loc.filename._M_str;
    loc_16.filename._M_len = loc.filename._M_len;
    loc_16.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_16.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>(this,loc_16,out_expr);
    break;
  case MemoryFill:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_28.filename._M_str = loc.filename._M_str;
    loc_28.filename._M_len = loc.filename._M_len;
    loc_28.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_28.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)30>>(this,loc_28,out_expr);
    break;
  case MemoryGrow:
    Consume(&token,this);
    loc_21.filename._M_str = loc.filename._M_str;
    loc_21.filename._M_len = loc.filename._M_len;
    loc_21.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_21.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)31>>(this,loc_21,out_expr);
    break;
  case MemoryInit:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_23.filename._M_str = loc.filename._M_str;
    loc_23.filename._M_len = loc.filename._M_len;
    loc_23.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_23.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseMemoryInstrVar<wabt::MemoryVarExpr<(wabt::ExprType)32>>(this,loc_23,out_expr);
    break;
  case MemorySize:
    Consume(&token,this);
    loc_18.filename._M_str = loc.filename._M_str;
    loc_18.filename._M_len = loc.filename._M_len;
    loc_18.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_18.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseMemoryExpr<wabt::MemoryExpr<(wabt::ExprType)33>>(this,loc_18,out_expr);
    break;
  case Nop:
    Consume(&token,this);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = Nop;
    ppuVar8 = &PTR__Expr_00192d90;
    goto LAB_0013278b;
  case RefFunc:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_24.filename._M_str = loc.filename._M_str;
    loc_24.filename._M_len = loc.filename._M_len;
    loc_24.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_24.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)36>>(this,loc_24,out_expr);
    break;
  case RefIsNull:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = RefIsNull;
    ppuVar8 = &PTR__Expr_00193890;
    goto LAB_0013278b;
  case RefNull:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    RVar5 = ParseRefKind(this,(Type *)&token);
    if (RVar5.enum_ == Error) goto LAB_00132b33;
    pEVar7 = (Expr *)operator_new(0x48);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    pEVar7->type_ = RefNull;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_00193840;
    *(size_t *)&pEVar7->field_0x3c = token.loc.filename._M_len;
    goto LAB_0013278e;
  case Rethrow:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_02.filename._M_str = loc.filename._M_str;
    loc_02.filename._M_len = loc.filename._M_len;
    loc_02.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_02.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>(this,loc_02,out_expr);
    break;
  case ReturnCallIndirect:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    std::make_unique<wabt::ReturnCallIndirectExpr,wabt::Location&>(&token.loc);
    this_03 = &local_c0;
LAB_00131dd7:
    out_var = (Var *)(token.loc.filename._M_len + 0x130);
    Var::Var(this_03,0,&loc);
    ParseVarOpt(this,out_var,this_03);
    Var::~Var(this_03);
    RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)(token.loc.filename._M_len + 0x40));
    if ((RVar5.enum_ == Error) ||
       (RVar5 = ParseUnboundFuncSignature(this,(FuncSignature *)(token.loc.filename._M_len + 0x90)),
       sVar1 = token.loc.filename._M_len, RVar5.enum_ == Error)) {
      if (token.loc.filename._M_len != 0) {
        (**(code **)(*(long *)token.loc.filename._M_len + 8))();
      }
      goto LAB_00132b33;
    }
    token.loc.filename._M_len = 0;
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)sVar1;
    if (pEVar7 != (Expr *)0x0) {
      (*pEVar7->_vptr_Expr[1])();
      pEVar11 = (Expr *)token.loc.filename._M_len;
      goto LAB_00132794;
    }
    goto LAB_00132cab;
  case ReturnCall:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_05.filename._M_str = loc.filename._M_str;
    loc_05.filename._M_len = loc.filename._M_len;
    loc_05.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_05.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)40>>(this,loc_05,out_expr);
    break;
  case Return:
    Consume(&token,this);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = Return;
    ppuVar8 = &PTR__Expr_00192ef0;
    goto LAB_0013278b;
  case Select:
    Consume(&token,this);
    token.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    token.loc.filename._M_len = 0;
    token.loc.filename._M_str = (char *)0x0;
    if ((((this->options_->features).reference_types_enabled_ == true) &&
        (bVar2 = PeekMatchLpar(this,Result), bVar2)) &&
       (RVar5 = ParseResultList(this,(TypeVector *)&token,
                                (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)0x0), RVar5.enum_ == Error)) {
      std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
      goto LAB_00132b33;
    }
    this_01 = (SelectExpr *)operator_new(0x58);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2b0,
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
    SelectExpr::SelectExpr(this_01,(TypeVector *)&local_2b0,&loc);
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_01;
    if (pEVar7 != (Expr *)0x0) {
      (*pEVar7->_vptr_Expr[1])();
    }
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_2b0);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
    goto LAB_00132cab;
  case SimdLaneOp:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    table_index.loc.filename._M_len = 0;
    loc_31.filename._M_str = loc.filename._M_str;
    loc_31.filename._M_len = loc.filename._M_len;
    loc_31.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_31.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParseSimdLane(this,loc_31,(uint64_t *)&table_index);
    if (RVar5.enum_ == Error) goto LAB_00132b33;
    this_00 = (CallRefExpr *)operator_new(0x48);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = SimdLaneOp;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr._vptr_Expr =
         (_func_int **)&PTR__Expr_00192578;
    *(Enum *)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.field_0x3c = OVar4.enum_;
    (this_00->function_type_index).loc.filename._M_len = table_index.loc.filename._M_len;
    goto LAB_001325a2;
  case SimdLoadLane:
    Consume(&local_258,this);
    loc_34.filename._M_str = loc.filename._M_str;
    loc_34.filename._M_len = loc.filename._M_len;
    loc_34.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_34.field_1._8_8_ = loc.field_1._8_8_;
    token_09.loc.filename._M_str = local_258.loc.filename._M_str;
    token_09.loc.filename._M_len = local_258.loc.filename._M_len;
    token_09.loc.field_1.field_1.offset = local_258.loc.field_1.field_1.offset;
    token_09.loc.field_1._8_8_ = local_258.loc.field_1._8_8_;
    token_09.token_type_ = local_258.token_type_;
    token_09._36_4_ = local_258._36_4_;
    token_09.field_2.text_._M_len = local_258.field_2.text_._M_len;
    token_09.field_2.text_._M_str = local_258.field_2.text_._M_str;
    token_09.field_2.literal_.text._M_str = local_258.field_2.literal_.text._M_str;
    RVar5 = ParseSIMDLoadStoreInstr<wabt::SimdLoadLaneExpr>(this,loc_34,token_09,out_expr);
    break;
  case SimdStoreLane:
    Consume(&local_298,this);
    loc_00.filename._M_str = loc.filename._M_str;
    loc_00.filename._M_len = loc.filename._M_len;
    loc_00.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_00.field_1._8_8_ = loc.field_1._8_8_;
    token_00.loc.filename._M_str = local_298.loc.filename._M_str;
    token_00.loc.filename._M_len = local_298.loc.filename._M_len;
    token_00.loc.field_1.field_1.offset = local_298.loc.field_1.field_1.offset;
    token_00.loc.field_1._8_8_ = local_298.loc.field_1._8_8_;
    token_00.token_type_ = local_298.token_type_;
    token_00._36_4_ = local_298._36_4_;
    token_00.field_2.text_._M_len = local_298.field_2.text_._M_len;
    token_00.field_2.text_._M_str = local_298.field_2.text_._M_str;
    token_00.field_2.literal_.text._M_str = local_298.field_2.literal_.text._M_str;
    RVar5 = ParseSIMDLoadStoreInstr<wabt::SimdStoreLaneExpr>(this,loc_00,token_00,out_expr);
    break;
  case SimdShuffleOp:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    for (lane_00 = 0; lane_00 != 0x10; lane_00 = lane_00 + 1) {
      GetLocation(&local_2d0,this);
      loc_17.filename._M_str = local_2d0.filename._M_str;
      loc_17.filename._M_len = local_2d0.filename._M_len;
      loc_17.field_1.field_1.offset = local_2d0.field_1.field_1.offset;
      loc_17.field_1._8_8_ = local_2d0.field_1._8_8_;
      RVar5 = ParseSimdLane(this,loc_17,&lane_idx);
      if (RVar5.enum_ == Error) goto LAB_00132b33;
      v128::From<unsigned_char>((v128 *)&table_index,lane_00,(uchar)lane_idx);
    }
    this_00 = (CallRefExpr *)operator_new(0x50);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = SimdShuffleOp;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr._vptr_Expr =
         (_func_int **)&PTR__Expr_001925c8;
    *(Enum *)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.field_0x3c = OVar4.enum_;
    (this_00->function_type_index).loc.filename._M_len = table_index.loc.filename._M_len;
    (this_00->function_type_index).loc.filename._M_str = table_index.loc.filename._M_str;
    goto LAB_001325a2;
  case Store:
    Consume(&local_218,this);
    loc_32.filename._M_str = loc.filename._M_str;
    loc_32.filename._M_len = loc.filename._M_len;
    loc_32.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_32.field_1._8_8_ = loc.field_1._8_8_;
    token_08.loc.filename._M_str = local_218.loc.filename._M_str;
    token_08.loc.filename._M_len = local_218.loc.filename._M_len;
    token_08.loc.field_1.field_1.offset = local_218.loc.field_1.field_1.offset;
    token_08.loc.field_1._8_8_ = local_218.loc.field_1._8_8_;
    token_08.token_type_ = local_218.token_type_;
    token_08._36_4_ = local_218._36_4_;
    token_08.field_2.text_._M_len = local_218.field_2.text_._M_len;
    token_08.field_2.text_._M_str = local_218.field_2.text_._M_str;
    token_08.field_2.literal_.text._M_str = local_218.field_2.literal_.text._M_str;
    RVar5 = ParseLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)49>>
                      (this,loc_32,token_08,out_expr);
    break;
  case TableCopy:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    Var::Var((Var *)&token,0,&loc);
    Var::Var(&table_index,0,&loc);
    if ((this->options_->features).reference_types_enabled_ == true) {
      Var::Var(&local_108,(Var *)&token);
      ParseVarOpt(this,(Var *)&token,&local_108);
      Var::~Var(&local_108);
      Var::Var(&local_150,&table_index);
      ParseVarOpt(this,&table_index,&local_150);
      Var::~Var(&local_150);
    }
    this_02 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr(this_02,(Var *)&token,&table_index,&loc);
    goto LAB_00132c80;
  case TableFill:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_11.filename._M_str = loc.filename._M_str;
    loc_11.filename._M_len = loc.filename._M_len;
    loc_11.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_11.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)57>>(this,loc_11,out_expr);
    break;
  case TableGet:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_29.filename._M_str = loc.filename._M_str;
    loc_29.filename._M_len = loc.filename._M_len;
    loc_29.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_29.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)53>>(this,loc_29,out_expr);
    break;
  case TableGrow:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_35.filename._M_str = loc.filename._M_str;
    loc_35.filename._M_len = loc.filename._M_len;
    loc_35.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_35.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>(this,loc_35,out_expr);
    break;
  case TableInit:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    Var::Var((Var *)&token,0,&loc);
    RVar5 = ParseVar(this,(Var *)&token);
    if (RVar5.enum_ == Error) {
      Var::~Var((Var *)&token);
      goto LAB_00132b33;
    }
    Var::Var(&table_index,0,&loc);
    Var::Var(&local_198,&table_index);
    bVar2 = ParseVarOpt(this,&table_index,&local_198);
    Var::~Var(&local_198);
    if (bVar2) {
      std::swap<wabt::Var>((Var *)&token,&table_index);
    }
    this_02 = (TableCopyExpr *)operator_new(0xd0);
    TableInitExpr::TableInitExpr((TableInitExpr *)this_02,(Var *)&token,&table_index,&loc);
LAB_00132c80:
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_02;
    if (pEVar7 != (Expr *)0x0) {
      (*pEVar7->_vptr_Expr[1])();
    }
    Var::~Var(&table_index);
    Var::~Var((Var *)&token);
    goto LAB_00132cab;
  case TableSet:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_25.filename._M_str = loc.filename._M_str;
    loc_25.filename._M_len = loc.filename._M_len;
    loc_25.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_25.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)56>>(this,loc_25,out_expr);
    break;
  case TableSize:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_22.filename._M_str = loc.filename._M_str;
    loc_22.filename._M_len = loc.filename._M_len;
    loc_22.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_22.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)55>>(this,loc_22,out_expr);
    break;
  case Ternary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    this_00 = (CallRefExpr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = Ternary;
    ppuVar8 = &PTR__Expr_00193c98;
    goto LAB_0013259b;
  case Throw:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_33.filename._M_str = loc.filename._M_str;
    loc_33.filename._M_len = loc.filename._M_len;
    loc_33.field_1.field_1.offset = loc.field_1.field_1.offset;
    loc_33.field_1._8_8_ = loc.field_1._8_8_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)59>>(this,loc_33,out_expr);
    break;
  case Unary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    this_00 = (CallRefExpr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    next_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.super_intrusive_list_base<wabt::Expr>.
    prev_ = (Expr *)0x0;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_len =
         loc.filename._M_len;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.filename._M_str =
         loc.filename._M_str;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1.field_1.offset =
         (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.loc.field_1 + 8) =
         loc.field_1._8_8_;
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.type_ = Unary;
    ppuVar8 = &PTR__Expr_00193308;
LAB_0013259b:
    (this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr._vptr_Expr = (_func_int **)ppuVar8;
    *(Enum *)&(this_00->super_ExprMixin<(wabt::ExprType)14>).super_Expr.field_0x3c = OVar4.enum_;
LAB_001325a2:
    pEVar11 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    goto LAB_00132794;
  case Last_Opcode:
    Consume(&token,this);
    pEVar7 = (Expr *)operator_new(0x40);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar7->loc).filename._M_len = loc.filename._M_len;
    (pEVar7->loc).filename._M_str = loc.filename._M_str;
    (pEVar7->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = loc.field_1._8_8_;
    pEVar7->type_ = Last;
    ppuVar8 = &PTR__Expr_00192d58;
LAB_0013278b:
    pEVar7->_vptr_Expr = (_func_int **)ppuVar8;
LAB_0013278e:
    pEVar11 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar7;
LAB_00132794:
    if (pEVar11 != (Expr *)0x0) {
      (*pEVar11->_vptr_Expr[1])();
    }
    goto LAB_00132cab;
  }
  if (RVar5.enum_ == Error) {
LAB_00132b33:
    EVar6 = Error;
  }
  else {
LAB_00132cab:
    EVar6 = Ok;
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          PeekMatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseResultList(&result, nullptr));
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrTable: {
      Consume();
      auto expr = std::make_unique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = std::make_unique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::CallRef: {
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new CallRefExpr(loc));
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<ReturnCallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(ParseLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(ParseLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryBinaryExpr<MemoryCopyExpr>(loc, out_expr));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryExpr<MemoryFillExpr>(loc, out_expr));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParseMemoryInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemorySizeExpr>(loc, out_expr));
      break;

    case TokenType::MemoryGrow:
      Consume();
      CHECK_RESULT(ParseMemoryExpr<MemoryGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull: {
      ErrorUnlessOpcodeEnabled(Consume());
      Type type;
      CHECK_RESULT(ParseRefKind(&type));
      out_expr->reset(new RefNullExpr(type, loc));
      break;
    }

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RethrowExpr>(loc, out_expr));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicFence: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint32_t consistency_model = 0x0;
      out_expr->reset(new AtomicFenceExpr(consistency_model, loc));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(ParseLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParseLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);

      uint64_t lane_idx = 0;
      Result result = ParseSimdLane(loc, &lane_idx);

      if (Failed(result)) {
        return Result::Error;
      }

      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdLoadLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdLoadLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdStoreLane: {
      CHECK_RESULT(
          ParseSIMDLoadStoreInstr<SimdStoreLaneExpr>(loc, Consume(), out_expr));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      v128 values;
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();
        uint64_t lane_idx;
        Result result = ParseSimdLane(loc, &lane_idx);
        if (Failed(result)) {
          return Result::Error;
        }

        values.set_u8(lane, static_cast<uint8_t>(lane_idx));
      }

      out_expr->reset(new SimdShuffleOpExpr(token.opcode(), values, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}